

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

void predict_or_learn_logistic<true>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  pointer pfVar5;
  long lVar6;
  float fVar7;
  float __x;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_50;
  
  fVar2 = ec->weight;
  iVar4 = o->t + 1;
  fVar7 = (float)iVar4;
  o->t = iVar4;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  local_50 = 0.0;
  if (0 < o->N) {
    __x = 0.0;
    local_50 = 0.0;
    lVar6 = 0;
    do {
      fVar8 = expf(__x);
      ec->weight = (1.0 / (fVar8 + 1.0)) * fVar2;
      iVar4 = (int)lVar6;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar4);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar4);
      fVar8 = (ec->pred).scalar;
      fVar9 = (ec->l).simple.label * fVar8;
      fVar3 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      __x = fVar9 * fVar3 + __x;
      fVar10 = expf(__x);
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5[lVar6] = ((4.0 / fVar7) * fVar9) / (fVar10 + 1.0) + pfVar5[lVar6];
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar9 = pfVar5[lVar6];
      if (2.0 < fVar9) {
        pfVar5[lVar6] = 2.0;
        pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar9 = pfVar5[lVar6];
      }
      if (fVar9 < -2.0) {
        pfVar5[lVar6] = -2.0;
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar4);
      local_50 = local_50 + fVar8 * fVar3;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar4);
      lVar6 = lVar6 + 1;
    } while (lVar6 < o->N);
  }
  ec->weight = fVar2;
  ec->partial_prediction = local_50;
  fVar7 = *(float *)(&DAT_002ab258 + (ulong)(0.0 < local_50) * 4);
  (ec->pred).scalar = fVar7;
  ec->loss = (float)(~-(uint)(fVar7 == (ec->l).simple.label) & (uint)fVar2);
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}